

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall FFont::~FFont(FFont *this)

{
  int iVar1;
  int iVar2;
  CharData *pCVar3;
  long *plVar4;
  FFont *pFVar5;
  FFont **ppFVar6;
  FFont **ppFVar7;
  int i;
  long lVar8;
  long lVar9;
  
  this->_vptr_FFont = (_func_int **)&PTR__FFont_006f91f8;
  if (this->Chars != (CharData *)0x0) {
    iVar1 = this->LastChar;
    iVar2 = this->FirstChar;
    lVar9 = 0;
    for (lVar8 = 0; pCVar3 = this->Chars, lVar8 <= (long)iVar1 - (long)iVar2; lVar8 = lVar8 + 1) {
      plVar4 = *(long **)((long)&pCVar3->Pic + lVar9);
      if ((plVar4 != (long *)0x0) && (*(char *)plVar4[5] == '\0')) {
        (**(code **)(*plVar4 + 8))();
      }
      lVar9 = lVar9 + 0x10;
    }
    if (pCVar3 != (CharData *)0x0) {
      operator_delete__(pCVar3);
    }
    this->Chars = (CharData *)0x0;
  }
  if (this->PatchRemap != (BYTE *)0x0) {
    operator_delete__(this->PatchRemap);
    this->PatchRemap = (BYTE *)0x0;
  }
  if (this->Name != (char *)0x0) {
    operator_delete__(this->Name);
    this->Name = (char *)0x0;
  }
  ppFVar6 = &FirstFont;
  do {
    ppFVar7 = ppFVar6;
    pFVar5 = *ppFVar7;
    if (pFVar5 == (FFont *)0x0) break;
    ppFVar6 = &pFVar5->Next;
  } while (pFVar5 != this);
  if (pFVar5 != (FFont *)0x0) {
    *ppFVar7 = pFVar5->Next;
  }
  TArray<FRemapTable,_FRemapTable>::~TArray(&this->Ranges);
  return;
}

Assistant:

FFont::~FFont ()
{
	if (Chars)
	{
		int count = LastChar - FirstChar + 1;

		for (int i = 0; i < count; ++i)
		{
			if (Chars[i].Pic != NULL && Chars[i].Pic->Name[0] == 0)
			{
				delete Chars[i].Pic;
			}
		}
		delete[] Chars;
		Chars = NULL;
	}
	if (PatchRemap)
	{
		delete[] PatchRemap;
		PatchRemap = NULL;
	}
	if (Name)
	{
		delete[] Name;
		Name = NULL;
	}

	FFont **prev = &FirstFont;
	FFont *font = *prev;

	while (font != NULL && font != this)
	{
		prev = &font->Next;
		font = *prev;
	}

	if (font != NULL)
	{
		*prev = font->Next;
	}
}